

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O3

void __thiscall
capnp::InputStreamMessageReader::InputStreamMessageReader
          (InputStreamMessageReader *this,InputStream *inputStream,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  Array<kj::ArrayPtr<const_capnp::word>_> *pAVar1;
  byte **ppbVar2;
  word *pwVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  ArrayPtr<const_capnp::word> *pAVar6;
  long lVar7;
  ulong uVar8;
  Fault *pFVar9;
  ulong uVar10;
  Exception *pEVar11;
  Exception *pEVar12;
  long lVar13;
  ssize_t sVar14;
  ulong uVar15;
  uint64_t uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ReaderOptions options_00;
  Fault f_1;
  Array<capnp::_::DirectWireValue<unsigned_int>_> moreSizes_heap;
  WireValue<uint32_t> firstWord [2];
  WireValue<uint32_t> moreSizes_stack [16];
  ulong local_f8;
  Fault *local_f0;
  undefined8 *local_e0;
  Fault local_d0;
  ulong local_c8;
  undefined8 *local_c0;
  Fault *local_b8;
  ulong uStack_b0;
  undefined8 *local_a8;
  ulong local_a0;
  Array<capnp::word> *local_98;
  InputStream *local_90;
  uint local_88;
  uint local_84;
  uint64_t local_80;
  Fault local_78 [9];
  
  uVar18 = scratchSpace.size_;
  pEVar11 = (Exception *)scratchSpace.ptr;
  uVar16 = options.traversalLimitInWords;
  options_00._12_4_ = 0;
  options_00.traversalLimitInWords = SUB128(options._0_12_,0);
  options_00.nestingLimit = SUB124(options._0_12_,8);
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__InputStreamMessageReader_002c0430;
  this->inputStream = inputStream;
  pAVar1 = &this->moreSegments;
  local_98 = &this->ownedSpace;
  this->readPos = (byte *)0x0;
  (this->segment0).ptr = (word *)0x0;
  (this->segment0).size_ = 0;
  (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)0x0;
  (this->moreSegments).size_ = 0;
  (this->moreSegments).disposer = (ArrayDisposer *)0x0;
  (this->ownedSpace).ptr = (word *)0x0;
  (this->ownedSpace).size_ = 0;
  (this->ownedSpace).disposer = (ArrayDisposer *)0x0;
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  kj::InputStream::read(inputStream,(int)&local_88,(void *)0x8,8);
  uVar15 = (ulong)local_88;
  uVar17 = local_88 + 1;
  local_90 = inputStream;
  local_80 = uVar16;
  if (uVar17 == 0) {
    uVar17 = 0;
    uVar19 = 0;
  }
  else {
    uVar8 = (ulong)local_84;
    uVar19 = uVar8;
    if (uVar17 < 0x200) {
      uVar20 = uVar17 & 0x1fe;
      uVar10 = (ulong)uVar20;
      local_a0 = uVar18;
      if (uVar20 < 0x11) {
        local_b8 = (Fault *)0x0;
        uStack_b0 = 0;
        local_a8 = (undefined8 *)0x0;
        pFVar9 = local_78;
        local_e0 = (undefined8 *)0x0;
        if (uVar15 == 0) {
          uVar17 = 1;
          local_f8 = 0;
          local_f0 = (Fault *)0x0;
          goto LAB_00203353;
        }
      }
      else {
        pFVar9 = (Fault *)kj::_::HeapArrayDisposer::allocateImpl
                                    (4,uVar10,uVar10,(_func_void_void_ptr *)0x0,
                                     (_func_void_void_ptr *)0x0);
        local_e0 = &kj::_::HeapArrayDisposer::instance;
        local_a8 = &kj::_::HeapArrayDisposer::instance;
        local_b8 = pFVar9;
        uStack_b0 = uVar10;
      }
      local_f8 = uStack_b0;
      local_f0 = local_b8;
      kj::InputStream::read
                (inputStream,(int)pFVar9,(void *)(ulong)(uVar20 * 4),(size_t)(ulong)(uVar20 * 4));
      uVar18 = local_a0;
      if (uVar15 == 0) {
        uVar17 = 1;
      }
      else {
        uVar10 = 0;
        do {
          uVar19 = uVar19 + *(uint *)((long)&pFVar9->exception + uVar10 * 4);
          uVar10 = uVar10 + 1;
        } while (uVar15 != uVar10);
      }
      goto LAB_00203353;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
              (local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xba,FAILED,"segmentCount < 512","\"Message has too many segments.\"",
               (char (*) [31])"Message has too many segments.");
    kj::_::Debug::Fault::~Fault(local_78);
    uVar17 = 1;
  }
  local_b8 = (Fault *)0x0;
  uStack_b0 = 0;
  local_a8 = (undefined8 *)0x0;
  pFVar9 = local_78;
  local_e0 = (undefined8 *)0x0;
  local_f8 = 0;
  local_f0 = (Fault *)0x0;
  uVar8 = (ulong)uVar17;
LAB_00203353:
  uVar16 = local_80;
  if (local_80 < uVar19) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[93]>
              (&local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xce,FAILED,"totalWords <= options.traversalLimitInWords",
               "\"Message is too large.  To increase the limit on the receiving end, see \" \"capnp::ReaderOptions.\""
               ,(char (*) [93])
                "Message is too large.  To increase the limit on the receiving end, see capnp::ReaderOptions."
              );
    kj::_::Debug::Fault::~Fault(&local_d0);
    if (uVar16 < uVar8) {
      uVar8 = uVar16;
    }
    uVar17 = 1;
    uVar19 = uVar8;
  }
  if (uVar18 < uVar19) {
    pEVar11 = (Exception *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (8,uVar19,uVar19,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_c0 = &kj::_::HeapArrayDisposer::instance;
    pwVar3 = local_98->ptr;
    local_d0.exception = pEVar11;
    local_c8 = uVar19;
    if (pwVar3 != (word *)0x0) {
      sVar4 = (this->ownedSpace).size_;
      local_98->ptr = (word *)0x0;
      local_98->size_ = 0;
      pAVar5 = (this->ownedSpace).disposer;
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pwVar3,8,sVar4,sVar4,0);
    }
    (this->ownedSpace).ptr = (word *)pEVar11;
    (this->ownedSpace).size_ = uVar19;
    (this->ownedSpace).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  }
  uVar8 = uVar8 & 0xffffffff;
  (this->segment0).ptr = (word *)pEVar11;
  (this->segment0).size_ = uVar8;
  if (uVar17 < 2) {
    if (uVar17 == 1) {
      kj::InputStream::read(local_90,(int)pEVar11,(void *)(uVar19 << 3),(size_t)(uVar19 << 3));
    }
  }
  else {
    uVar18 = (ulong)(uVar17 - 1);
    pEVar12 = (Exception *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x10,uVar18,uVar18,
                         kj::_::HeapArrayDisposer::
                         Allocate_<kj::ArrayPtr<const_capnp::word>,_false,_false>::construct,
                         kj::_::HeapArrayDisposer::
                         Allocate_<kj::ArrayPtr<const_capnp::word>,_false,_false>::destruct);
    local_c0 = &kj::_::HeapArrayDisposer::instance;
    pAVar6 = pAVar1->ptr;
    local_d0.exception = pEVar12;
    local_c8 = uVar18;
    if (pAVar6 != (ArrayPtr<const_capnp::word> *)0x0) {
      sVar4 = (this->moreSegments).size_;
      pAVar1->ptr = (ArrayPtr<const_capnp::word> *)0x0;
      (this->moreSegments).size_ = 0;
      pAVar5 = (this->moreSegments).disposer;
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pAVar6,0x10,sVar4,sVar4,0);
    }
    ppbVar2 = &this->readPos;
    (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)pEVar12;
    (this->moreSegments).size_ = uVar18;
    (this->moreSegments).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    lVar13 = 0;
    uVar15 = uVar8;
    do {
      uVar10 = (ulong)*(uint *)((long)&pFVar9->exception + lVar13);
      lVar7 = uVar15 - 10;
      uVar15 = uVar15 + uVar10;
      pAVar6 = pAVar1->ptr;
      *(void ***)((long)&pAVar6->ptr + lVar13 * 4) = pEVar11->trace + lVar7;
      *(ulong *)((long)&pAVar6->size_ + lVar13 * 4) = uVar10;
      lVar13 = lVar13 + 4;
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
    *ppbVar2 = (byte *)pEVar11;
    sVar14 = kj::InputStream::read(local_90,(int)pEVar11,(void *)(uVar8 << 3),uVar19 << 3);
    *ppbVar2 = *ppbVar2 + sVar14;
  }
  if (local_f0 != (Fault *)0x0) {
    local_b8 = (Fault *)0x0;
    uStack_b0 = 0;
    (**(code **)*local_e0)(local_e0,local_f0,4,local_f8,local_f8,0);
  }
  return;
}

Assistant:

InputStreamMessageReader::InputStreamMessageReader(
    kj::InputStream& inputStream, ReaderOptions options, kj::ArrayPtr<word> scratchSpace)
    : MessageReader(options), inputStream(inputStream), readPos(nullptr) {
  _::WireValue<uint32_t> firstWord[2];

  inputStream.read(firstWord, sizeof(firstWord));

  uint segmentCount = firstWord[0].get() + 1;
  uint segment0Size = segmentCount == 0 ? 0 : firstWord[1].get();

  size_t totalWords = segment0Size;

  // Reject messages with too many segments for security reasons.
  KJ_REQUIRE(segmentCount < 512, "Message has too many segments.") {
    segmentCount = 1;
    segment0Size = 1;
    break;
  }

  // Read sizes for all segments except the first.  Include padding if necessary.
  KJ_STACK_ARRAY(_::WireValue<uint32_t>, moreSizes, segmentCount & ~1, 16, 64);
  if (segmentCount > 1) {
    inputStream.read(moreSizes.begin(), moreSizes.size() * sizeof(moreSizes[0]));
    for (uint i = 0; i < segmentCount - 1; i++) {
      totalWords += moreSizes[i].get();
    }
  }

  // Don't accept a message which the receiver couldn't possibly traverse without hitting the
  // traversal limit.  Without this check, a malicious client could transmit a very large segment
  // size to make the receiver allocate excessive space and possibly crash.
  KJ_REQUIRE(totalWords <= options.traversalLimitInWords,
             "Message is too large.  To increase the limit on the receiving end, see "
             "capnp::ReaderOptions.") {
    segmentCount = 1;
    segment0Size = kj::min(segment0Size, options.traversalLimitInWords);
    totalWords = segment0Size;
    break;
  }

  if (scratchSpace.size() < totalWords) {
    // TODO(perf):  Consider allocating each segment as a separate chunk to reduce memory
    //   fragmentation.
    ownedSpace = kj::heapArray<word>(totalWords);
    scratchSpace = ownedSpace;
  }

  segment0 = scratchSpace.slice(0, segment0Size);

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);
    size_t offset = segment0Size;

    for (uint i = 0; i < segmentCount - 1; i++) {
      uint segmentSize = moreSizes[i].get();
      moreSegments[i] = scratchSpace.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  if (segmentCount == 1) {
    inputStream.read(scratchSpace.begin(), totalWords * sizeof(word));
  } else if (segmentCount > 1) {
    readPos = scratchSpace.asBytes().begin();
    readPos += inputStream.read(readPos, segment0Size * sizeof(word), totalWords * sizeof(word));
  }
}